

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaExporter::WriteNode(ColladaExporter *this,aiScene *pScene,aiNode *pNode)

{
  undefined1 *puVar1;
  string *psVar2;
  uint uVar3;
  uint uVar4;
  aiCamera **ppaVar5;
  aiCamera *paVar6;
  aiMesh *mesh;
  size_type sVar7;
  aiLight **ppaVar8;
  bool bVar9;
  string *psVar10;
  _Alloc_hider _Var11;
  int iVar12;
  aiBone *paVar13;
  aiBone *paVar14;
  size_t sVar15;
  ostream *poVar16;
  long *plVar17;
  ostream *poVar18;
  aiNode *paVar19;
  aiScene *paVar20;
  long *plVar21;
  size_t i;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  size_t a;
  long lVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  string node_name_escaped;
  stringstream ss;
  allocator<char> local_2c1;
  string *local_2c0;
  string local_2b8;
  undefined8 local_298;
  undefined8 uStack_290;
  string local_288;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  aiScene *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1d0;
  undefined8 uStack_1c0;
  float local_1b8;
  undefined8 local_1b4;
  undefined8 uStack_1ac;
  float local_1a4;
  ios_base local_160 [264];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  if ((pNode->mName).length == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1e0 + 0x10),"Node_",5);
    std::ostream::_M_insert<void_const*>((ostream *)(local_1e0 + 0x10));
    std::__cxx11::stringbuf::str();
    sVar7 = local_2b8._M_string_length;
    _Var11._M_p = local_2b8._M_dataplus._M_p;
    if (local_2b8._M_string_length < 0x400) {
      (pNode->mName).length = (ai_uint32)local_2b8._M_string_length;
      memcpy((pNode->mName).data,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
      (pNode->mName).data[sVar7] = '\0';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var11._M_p != &local_2b8.field_2) {
      operator_delete(_Var11._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
    std::ios_base::~ios_base(local_160);
  }
  local_2c0 = (string *)(pNode->mName).data;
  paVar13 = findBone(pScene,(char *)local_2c0);
  local_230 = pScene;
  if (paVar13 == (aiBone *)0x0) {
    pcVar24 = "NODE";
  }
  else {
    if ((pNode->mParent == (aiNode *)0x0) ||
       (paVar14 = findBone(pScene,(pNode->mParent->mName).data), paVar14 == (aiBone *)0x0)) {
      bVar9 = true;
      pcVar24 = "JOINT";
      goto LAB_0065c8e2;
    }
    pcVar24 = "JOINT";
  }
  bVar9 = false;
LAB_0065c8e2:
  psVar10 = local_2c0;
  local_1e0._0_8_ = local_1e0 + 0x10;
  sVar15 = strlen((char *)local_2c0);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,psVar10,psVar10 + sVar15);
  XMLEscape(&local_2b8,(string *)local_1e0);
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_,
                    CONCAT44(aStack_1d0._M_allocated_capacity._4_4_,
                             aStack_1d0._M_allocated_capacity._0_4_) + 1);
  }
  puVar1 = &this->field_0x38;
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                       (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<node ",6);
  if (bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"id=\"",4);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar1,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" ",2);
    if (paVar13 == (aiBone *)0x0) {
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
    }
    else {
      std::operator+(&local_228,"sid=\"",&local_2b8);
      plVar17 = (long *)std::__cxx11::string::append((char *)&local_228);
      local_1e0._0_8_ = local_1e0 + 0x10;
      plVar21 = plVar17 + 2;
      if ((long *)*plVar17 == plVar21) {
        aStack_1d0._8_8_ = plVar17[3];
        aStack_1d0._M_allocated_capacity._0_4_ = (undefined4)*plVar21;
        aStack_1d0._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar21 >> 0x20);
      }
      else {
        aStack_1d0._M_allocated_capacity._0_4_ = (undefined4)*plVar21;
        aStack_1d0._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar21 >> 0x20);
        local_1e0._0_8_ = (long *)*plVar17;
      }
      local_1e0._8_4_ = (undefined4)plVar17[1];
      local_1e0._12_4_ = (undefined4)((ulong)plVar17[1] >> 0x20);
      *plVar17 = (long)plVar21;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,(char *)local_1e0._0_8_,CONCAT44(local_1e0._12_4_,local_1e0._8_4_));
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,
                      CONCAT44(aStack_1d0._M_allocated_capacity._4_4_,
                               aStack_1d0._M_allocated_capacity._0_4_) + 1);
    }
    if ((paVar13 != (aiBone *)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2)) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&this->mFoundSkeletonRootNodeID);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"id=\"",4);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar1,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" ",2);
    if (paVar13 == (aiBone *)0x0) {
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
    }
    else {
      std::operator+(&local_228,"sid=\"",&local_2b8);
      plVar17 = (long *)std::__cxx11::string::append((char *)&local_228);
      local_1e0._0_8_ = local_1e0 + 0x10;
      plVar21 = plVar17 + 2;
      if ((long *)*plVar17 == plVar21) {
        aStack_1d0._8_8_ = plVar17[3];
        aStack_1d0._M_allocated_capacity._0_4_ = (undefined4)*plVar21;
        aStack_1d0._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar21 >> 0x20);
      }
      else {
        aStack_1d0._M_allocated_capacity._0_4_ = (undefined4)*plVar21;
        aStack_1d0._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar21 >> 0x20);
        local_1e0._0_8_ = (long *)*plVar17;
      }
      local_1e0._8_4_ = (undefined4)plVar17[1];
      local_1e0._12_4_ = (undefined4)((ulong)plVar17[1] >> 0x20);
      *plVar17 = (long)plVar21;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,(char *)local_1e0._0_8_,CONCAT44(local_1e0._12_4_,local_1e0._8_4_));
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,
                      CONCAT44(aStack_1d0._M_allocated_capacity._4_4_,
                               aStack_1d0._M_allocated_capacity._0_4_) + 1);
    }
    if ((paVar13 != (aiBone *)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2)) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," name=\"",7);
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar1,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" type=\"",8);
  sVar15 = strlen(pcVar24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar24,sVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\">",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  psVar2 = &this->startstr;
  std::__cxx11::string::append((char *)psVar2);
  local_298._0_4_ = (pNode->mTransformation).a1;
  local_298._4_4_ = (pNode->mTransformation).a2;
  uStack_290._0_4_ = (pNode->mTransformation).a3;
  uStack_290._4_4_ = (pNode->mTransformation).a4;
  local_248._0_4_ = (pNode->mTransformation).b1;
  local_248._4_4_ = (pNode->mTransformation).b2;
  uStack_240._0_4_ = (pNode->mTransformation).b3;
  uStack_240._4_4_ = (pNode->mTransformation).b4;
  local_258._0_4_ = (pNode->mTransformation).c1;
  local_258._4_4_ = (pNode->mTransformation).c2;
  uStack_250._0_4_ = (pNode->mTransformation).c3;
  uStack_250._4_4_ = (pNode->mTransformation).c4;
  local_268._0_4_ = (pNode->mTransformation).d1;
  local_268._4_4_ = (pNode->mTransformation).d2;
  uStack_260._0_4_ = (pNode->mTransformation).d3;
  uStack_260._4_4_ = (pNode->mTransformation).d4;
  uVar23 = (ulong)this->mScene->mNumCameras;
  if (uVar23 != 0) {
    ppaVar5 = this->mScene->mCameras;
    uVar3 = (pNode->mName).length;
    uVar22 = 0;
    do {
      paVar6 = ppaVar5[uVar22];
      if ((paVar6->mName).length == uVar3) {
        iVar12 = bcmp((paVar6->mName).data,local_2c0,(ulong)uVar3);
        if (iVar12 == 0) {
          local_1e0._0_4_ = 1.0;
          local_1e0._4_4_ = 0.0;
          local_1e0._8_4_ = 0.0;
          local_1e0._12_4_ = 0.0;
          aStack_1d0._M_allocated_capacity._0_4_ = 0.0;
          aStack_1d0._M_allocated_capacity._4_4_ = 1.0;
          aStack_1d0._8_8_ = 0;
          uStack_1c0._0_4_ = 0.0;
          uStack_1c0._4_4_ = 0.0;
          local_1b8 = 1.0;
          local_1b4._0_4_ = 0.0;
          local_1b4._4_4_ = 0.0;
          uStack_1ac._0_4_ = 0.0;
          uStack_1ac._4_4_ = 0.0;
          local_1a4 = 1.0;
          aiCamera::GetCameraMatrix(ppaVar5[uVar22],(aiMatrix4x4 *)local_1e0);
          fVar30 = (float)local_1e0._0_4_ * 0.0 + (float)local_1e0._4_4_ * 0.0;
          fVar29 = fVar30 + (float)local_1e0._8_4_ * 0.0 + (float)local_1e0._12_4_;
          fVar26 = (float)local_1e0._12_4_ * 0.0;
          fVar28 = ((float)local_1e0._4_4_ * 0.0 - (float)local_1e0._0_4_) +
                   (float)local_1e0._8_4_ * 0.0 + fVar26;
          local_48 = ZEXT416((uint)fVar28);
          fVar27 = fVar26 + (float)local_1e0._8_4_ * 0.0 +
                            (float)local_1e0._0_4_ * 0.0 + (float)local_1e0._4_4_;
          fVar26 = fVar26 + (float)local_1e0._8_4_ * -1.0 + fVar30;
          fVar38 = (float)aStack_1d0._M_allocated_capacity._0_4_ * 0.0 +
                   (float)aStack_1d0._M_allocated_capacity._4_4_ * 0.0;
          fVar36 = fVar38 + (float)aStack_1d0._8_4_ * 0.0 + (float)aStack_1d0._12_4_;
          fVar31 = (float)aStack_1d0._12_4_ * 0.0;
          fVar30 = ((float)aStack_1d0._M_allocated_capacity._4_4_ * 0.0 -
                   (float)aStack_1d0._M_allocated_capacity._0_4_) + (float)aStack_1d0._8_4_ * 0.0 +
                   fVar31;
          fVar32 = fVar31 + (float)aStack_1d0._8_4_ * 0.0 +
                            (float)aStack_1d0._M_allocated_capacity._0_4_ * 0.0 +
                            (float)aStack_1d0._M_allocated_capacity._4_4_;
          fVar31 = fVar31 + (float)aStack_1d0._8_4_ * -1.0 + fVar38;
          fStack_54 = (float)uStack_1c0 * 0.0 + uStack_1c0._4_4_ * 0.0;
          local_58 = fStack_54 + local_1b8 * 0.0 + (float)local_1b4;
          fVar41 = (float)local_1b4 * 0.0;
          fVar33 = (uStack_1c0._4_4_ * 0.0 - (float)uStack_1c0) + local_1b8 * 0.0 + fVar41;
          fVar42 = fVar41 + local_1b8 * 0.0 + (float)uStack_1c0 * 0.0 + uStack_1c0._4_4_;
          fVar41 = fVar41 + local_1b8 * -1.0 + fStack_54;
          fVar38 = local_1b4._4_4_ * 0.0 + (float)uStack_1ac * 0.0;
          fVar44 = fVar38 + uStack_1ac._4_4_ * 0.0 + local_1a4;
          fVar34 = local_1a4 * 0.0;
          fVar43 = ((float)uStack_1ac * 0.0 - local_1b4._4_4_) + uStack_1ac._4_4_ * 0.0 + fVar34;
          fVar35 = fVar34 + uStack_1ac._4_4_ * 0.0 + local_1b4._4_4_ * 0.0 + (float)uStack_1ac;
          fVar34 = fVar34 + uStack_1ac._4_4_ * -1.0 + fVar38;
          fStack_204 = fVar30 * local_248._4_4_;
          local_208 = fVar30 * local_298._4_4_;
          fStack_200 = fVar30 * local_258._4_4_;
          fStack_1fc = fVar30 * local_268._4_4_;
          fVar37 = fVar36 * local_298._4_4_;
          fVar39 = fVar36 * local_248._4_4_;
          fVar40 = fVar36 * local_258._4_4_;
          fVar36 = fVar36 * local_268._4_4_;
          local_1f8 = fVar26 * (float)local_298 + fVar31 * local_298._4_4_;
          fStack_1f4 = fVar26 * (float)local_248 + fVar31 * local_248._4_4_;
          fStack_1f0 = fVar26 * (float)local_258 + fVar31 * local_258._4_4_;
          fStack_1ec = fVar26 * (float)local_268 + fVar31 * local_268._4_4_;
          fVar26 = fVar29 * (float)local_298;
          fVar31 = fVar29 * (float)local_248;
          fVar38 = fVar29 * (float)local_258;
          fVar29 = fVar29 * (float)local_268;
          local_268 = CONCAT44(uStack_260._4_4_ * fVar35 +
                               fVar42 * (float)uStack_260 +
                               (float)local_268 * fVar27 + fVar32 * local_268._4_4_,
                               fVar43 * uStack_260._4_4_ +
                               fVar33 * (float)uStack_260 +
                               fVar28 * (float)local_268 + fVar30 * local_268._4_4_);
          uStack_260 = CONCAT44(fVar44 * uStack_260._4_4_ +
                                local_58 * (float)uStack_260 + fVar29 + fVar36,
                                fVar34 * uStack_260._4_4_ + (float)uStack_260 * fVar41 + fStack_1ec)
          ;
          local_258 = CONCAT44(uStack_250._4_4_ * fVar35 +
                               fVar42 * (float)uStack_250 +
                               (float)local_258 * fVar27 + fVar32 * local_258._4_4_,
                               fVar43 * uStack_250._4_4_ +
                               fVar33 * (float)uStack_250 +
                               fVar28 * (float)local_258 + fVar30 * local_258._4_4_);
          uStack_250 = CONCAT44(fVar44 * uStack_250._4_4_ +
                                local_58 * (float)uStack_250 + fVar38 + fVar40,
                                fVar34 * uStack_250._4_4_ + (float)uStack_250 * fVar41 + fStack_1f0)
          ;
          local_298 = (ostream *)
                      CONCAT44(uStack_290._4_4_ * fVar35 +
                               fVar42 * (float)uStack_290 +
                               (float)local_298 * fVar27 + fVar32 * local_298._4_4_,
                               fVar43 * uStack_290._4_4_ +
                               fVar33 * (float)uStack_290 +
                               fVar28 * (float)local_298 + fVar30 * local_298._4_4_);
          uStack_290 = CONCAT44(fVar44 * uStack_290._4_4_ +
                                local_58 * (float)uStack_290 + fVar26 + fVar37,
                                fVar34 * uStack_290._4_4_ + (float)uStack_290 * fVar41 + local_1f8);
          local_248 = CONCAT44(uStack_240._4_4_ * fVar35 +
                               fVar42 * (float)uStack_240 +
                               (float)local_248 * fVar27 + fVar32 * local_248._4_4_,
                               fVar43 * uStack_240._4_4_ +
                               fVar33 * (float)uStack_240 +
                               fVar28 * (float)local_248 + fVar30 * local_248._4_4_);
          uStack_240 = CONCAT44(fVar44 * uStack_240._4_4_ +
                                local_58 * (float)uStack_240 + fVar31 + fVar39,
                                fVar34 * uStack_240._4_4_ + (float)uStack_240 * fVar41 + fStack_1f4)
          ;
          fStack_50 = fStack_54;
          fStack_4c = fStack_54;
          break;
        }
      }
      uVar22 = uVar22 + 1;
    } while (uVar23 != uVar22);
  }
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                       (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<matrix sid=\"matrix\">",0x15);
  poVar16 = std::ostream::_M_insert<double>((double)(float)local_298);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)local_298._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)(float)uStack_290);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)uStack_290._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)(float)local_248);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)local_248._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)(float)uStack_240);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)uStack_240._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)(float)local_258);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)local_258._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)(float)uStack_250);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)uStack_250._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)(float)local_268);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)local_268._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)(float)uStack_260);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  std::ostream::_M_insert<double>((double)uStack_260._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"</matrix>",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  local_298 = (ostream *)puVar1;
  if (pNode->mNumMeshes == 0) {
    paVar20 = this->mScene;
    uVar3 = paVar20->mNumCameras;
    if ((ulong)uVar3 != 0) {
      ppaVar5 = paVar20->mCameras;
      uVar4 = (pNode->mName).length;
      uVar23 = 0;
      do {
        if ((ppaVar5[uVar23]->mName).length == uVar4) {
          iVar12 = bcmp((ppaVar5[uVar23]->mName).data,local_2c0,(ulong)uVar4);
          if (iVar12 == 0) {
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                                 (this->startstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,"<instance_camera url=\"#",0x17);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,"-camera\"/>",10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            paVar20 = this->mScene;
            break;
          }
        }
        uVar23 = uVar23 + 1;
      } while (uVar3 != uVar23);
    }
    uVar3 = paVar20->mNumLights;
    if ((ulong)uVar3 != 0) {
      ppaVar8 = paVar20->mLights;
      uVar4 = (pNode->mName).length;
      uVar23 = 0;
      do {
        if ((ppaVar8[uVar23]->mName).length == uVar4) {
          iVar12 = bcmp((ppaVar8[uVar23]->mName).data,local_2c0,(ulong)uVar4);
          if (iVar12 == 0) {
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (local_298,(this->startstr)._M_dataplus._M_p,
                                 (this->startstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,"<instance_light url=\"#",0x16);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,"-light\"/>",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            break;
          }
        }
        uVar23 = uVar23 + 1;
      } while (uVar3 != uVar23);
    }
  }
  else {
    local_2c0 = (string *)&this->mFoundSkeletonRootNodeID;
    uVar23 = 0;
    do {
      poVar16 = local_298;
      mesh = this->mScene->mMeshes[pNode->mMeshes[uVar23]];
      if ((mesh->mNumFaces != 0) && (mesh->mNumVertices != 0)) {
        pcVar24 = (this->startstr)._M_dataplus._M_p;
        sVar7 = (this->startstr)._M_string_length;
        if (mesh->mNumBones == 0) {
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>(local_298,pcVar24,sVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18,"<instance_geometry url=\"#",0x19);
          GetMeshId_abi_cxx11_(&local_288,this,(ulong)pNode->mMeshes[uVar23]);
          XMLEscape((string *)local_1e0,&local_288);
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar18,(char *)local_1e0._0_8_,
                               CONCAT44(local_1e0._12_4_,local_1e0._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\">",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
          if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
            operator_delete((void *)local_1e0._0_8_,
                            CONCAT44(aStack_1d0._M_allocated_capacity._4_4_,
                                     aStack_1d0._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)psVar2);
        }
        else {
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>(local_298,pcVar24,sVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18,"<instance_controller url=\"#",0x1b);
          GetMeshId_abi_cxx11_(&local_288,this,(ulong)pNode->mMeshes[uVar23]);
          XMLEscape((string *)local_1e0,&local_288);
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar18,(char *)local_1e0._0_8_,
                               CONCAT44(local_1e0._12_4_,local_1e0._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"-skin\">",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
          if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
            operator_delete((void *)local_1e0._0_8_,
                            CONCAT44(aStack_1d0._M_allocated_capacity._4_4_,
                                     aStack_1d0._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)psVar2);
          paVar19 = findSkeletonRootNode(local_230,mesh);
          if (paVar19 != (aiNode *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_288,(paVar19->mName).data,&local_2c1);
            XMLEscape((string *)local_1e0,&local_288);
            std::__cxx11::string::operator=(local_2c0,(string *)local_1e0);
            if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
              operator_delete((void *)local_1e0._0_8_,
                              CONCAT44(aStack_1d0._M_allocated_capacity._4_4_,
                                       aStack_1d0._M_allocated_capacity._0_4_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1
                             );
            }
          }
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,(this->startstr)._M_dataplus._M_p,
                               (this->startstr)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"<skeleton>#",0xb);
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar18,(this->mFoundSkeletonRootNodeID)._M_dataplus._M_p,
                               (this->mFoundSkeletonRootNodeID)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"</skeleton>",0xb);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        }
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"<bind_material>",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar2);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"<technique_common>",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar2);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"<instance_material symbol=\"defaultMaterial\" target=\"#",0x35);
        XMLEscape((string *)local_1e0,
                  &(this->materials).
                   super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                   ._M_impl.super__Vector_impl_data._M_start[mesh->mMaterialIndex].name);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,(char *)local_1e0._0_8_,
                             CONCAT44(local_1e0._12_4_,local_1e0._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
          operator_delete((void *)local_1e0._0_8_,
                          CONCAT44(aStack_1d0._M_allocated_capacity._4_4_,
                                   aStack_1d0._M_allocated_capacity._0_4_) + 1);
        }
        std::__cxx11::string::append((char *)psVar2);
        lVar25 = 0;
        do {
          if ((mesh->mTextureCoords[lVar25] != (aiVector3D *)0x0) && (mesh->mNumVertices != 0)) {
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,(this->startstr)._M_dataplus._M_p,
                                 (this->startstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,"<bind_vertex_input semantic=\"CHANNEL",0x24);
            poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,"\" input_semantic=\"TEXCOORD\" input_set=\"",0x27);
            poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)poVar18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\"/>",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 != 8);
        PopTag(this);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"</instance_material>",0x14);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"</technique_common>",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"</bind_material>",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        pcVar24 = (this->startstr)._M_dataplus._M_p;
        sVar7 = (this->startstr)._M_string_length;
        if (mesh->mNumBones == 0) {
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar24,sVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</instance_geometry>",0x14);
        }
        else {
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar24,sVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</instance_controller>",0x16);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < pNode->mNumMeshes);
  }
  paVar20 = local_230;
  if (pNode->mNumChildren != 0) {
    uVar23 = 0;
    do {
      WriteNode(this,paVar20,pNode->mChildren[uVar23]);
      uVar23 = uVar23 + 1;
    } while (uVar23 < pNode->mNumChildren);
  }
  PopTag(this);
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_298,(this->startstr)._M_dataplus._M_p,(this->startstr)._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</node>",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ColladaExporter::WriteNode( const aiScene* pScene, aiNode* pNode)
{
    // the node must have a name
    if (pNode->mName.length == 0)
    {
        std::stringstream ss;
        ss << "Node_" << pNode;
        pNode->mName.Set(ss.str());
    }

    // If the node is associated with a bone, it is a joint node (JOINT)
    // otherwise it is a normal node (NODE)
    const char * node_type;
    bool is_joint, is_skeleton_root = false;
    if (nullptr == findBone(pScene, pNode->mName.C_Str())) {
        node_type = "NODE";
        is_joint = false;
    } else {
        node_type = "JOINT";
        is_joint = true;
        if (!pNode->mParent || nullptr == findBone(pScene, pNode->mParent->mName.C_Str())) {
            is_skeleton_root = true;
        }
    }

    const std::string node_name_escaped = XMLEscape(pNode->mName.data);
	mOutput << startstr << "<node ";
	if(is_skeleton_root) {
		mOutput << "id=\"" << node_name_escaped << "\" " << (is_joint ? "sid=\"" + node_name_escaped +"\"" : "") ; // For now, only support one skeleton in a scene.
		mFoundSkeletonRootNodeID = node_name_escaped;
	} else {
		mOutput << "id=\"" << node_name_escaped << "\" " << (is_joint ? "sid=\"" + node_name_escaped +"\"": "") ;
	}
	
    mOutput << " name=\"" << node_name_escaped
            << "\" type=\"" << node_type
            << "\">" << endstr;
    PushTag();

    // write transformation - we can directly put the matrix there
    // TODO: (thom) decompose into scale - rot - quad to allow addressing it by animations afterwards
    aiMatrix4x4 mat = pNode->mTransformation;

    // If this node is a Camera node, the camera coordinate system needs to be multiplied in.
    // When importing from Collada, the mLookAt is set to 0, 0, -1, and the node transform is unchanged.
    // When importing from a different format, mLookAt is set to 0, 0, 1. Therefore, the local camera
    // coordinate system must be changed to matche the Collada specification.
    for (size_t i = 0; i<mScene->mNumCameras; i++){
        if (mScene->mCameras[i]->mName == pNode->mName){
            aiMatrix4x4 sourceView;
            mScene->mCameras[i]->GetCameraMatrix(sourceView);

            aiMatrix4x4 colladaView;
            colladaView.a1 = colladaView.c3 = -1; // move into -z space.
            mat *= (sourceView * colladaView);
            break;
        }
    }
	
	// customized, sid should be 'matrix' to match with loader code.
    //mOutput << startstr << "<matrix sid=\"transform\">";
	mOutput << startstr << "<matrix sid=\"matrix\">";
	
    mOutput << mat.a1 << " " << mat.a2 << " " << mat.a3 << " " << mat.a4 << " ";
    mOutput << mat.b1 << " " << mat.b2 << " " << mat.b3 << " " << mat.b4 << " ";
    mOutput << mat.c1 << " " << mat.c2 << " " << mat.c3 << " " << mat.c4 << " ";
    mOutput << mat.d1 << " " << mat.d2 << " " << mat.d3 << " " << mat.d4;
    mOutput << "</matrix>" << endstr;

    if(pNode->mNumMeshes==0){
        //check if it is a camera node
        for(size_t i=0; i<mScene->mNumCameras; i++){
            if(mScene->mCameras[i]->mName == pNode->mName){
                mOutput << startstr <<"<instance_camera url=\"#" << node_name_escaped << "-camera\"/>" << endstr;
                break;
            }
        }
        //check if it is a light node
        for(size_t i=0; i<mScene->mNumLights; i++){
            if(mScene->mLights[i]->mName == pNode->mName){
                mOutput << startstr <<"<instance_light url=\"#" << node_name_escaped << "-light\"/>" << endstr;
                break;
            }
        }

    }else
    // instance every geometry
    for( size_t a = 0; a < pNode->mNumMeshes; ++a )
    {
        const aiMesh* mesh = mScene->mMeshes[pNode->mMeshes[a]];
        // do not instantiate mesh if empty. I wonder how this could happen
        if( mesh->mNumFaces == 0 || mesh->mNumVertices == 0 )
            continue;

        if( mesh->mNumBones == 0 )
        {
            mOutput << startstr << "<instance_geometry url=\"#" << XMLEscape(GetMeshId( pNode->mMeshes[a])) << "\">" << endstr;
            PushTag();
        }
        else
        {
            mOutput << startstr
                    << "<instance_controller url=\"#" << XMLEscape(GetMeshId( pNode->mMeshes[a])) << "-skin\">"
                    << endstr;
            PushTag();

			// note! this mFoundSkeletonRootNodeID some how affects animation, it makes the mesh attaches to armature skeleton root node.
			// use the first bone to find skeleton root
			const aiNode * skeletonRootBoneNode = findSkeletonRootNode( pScene, mesh );
			if ( skeletonRootBoneNode ) {
				mFoundSkeletonRootNodeID = XMLEscape( skeletonRootBoneNode->mName.C_Str() );
			}
            mOutput << startstr << "<skeleton>#" << mFoundSkeletonRootNodeID << "</skeleton>" << endstr;
        }
        mOutput << startstr << "<bind_material>" << endstr;
        PushTag();
        mOutput << startstr << "<technique_common>" << endstr;
        PushTag();
        mOutput << startstr << "<instance_material symbol=\"defaultMaterial\" target=\"#" << XMLEscape(materials[mesh->mMaterialIndex].name) << "\">" << endstr;
        PushTag();
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( mesh->HasTextureCoords( static_cast<unsigned int>(a) ) )
                // semantic       as in <texture texcoord=...>
                // input_semantic as in <input semantic=...>
                // input_set      as in <input set=...>
                mOutput << startstr << "<bind_vertex_input semantic=\"CHANNEL" << a << "\" input_semantic=\"TEXCOORD\" input_set=\"" << a << "\"/>" << endstr;
        }
        PopTag();
        mOutput << startstr << "</instance_material>" << endstr;
        PopTag();
        mOutput << startstr << "</technique_common>" << endstr;
        PopTag();
        mOutput << startstr << "</bind_material>" << endstr;
        
        PopTag();
        if( mesh->mNumBones == 0)
            mOutput << startstr << "</instance_geometry>" << endstr;
        else
            mOutput << startstr << "</instance_controller>" << endstr;
    }

    // recurse into subnodes
    for( size_t a = 0; a < pNode->mNumChildren; ++a )
        WriteNode( pScene, pNode->mChildren[a]);

    PopTag();
    mOutput << startstr << "</node>" << endstr;
}